

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O1

QVariant * __thiscall
QPlainTextEdit::inputMethodQuery
          (QVariant *__return_storage_ptr__,QPlainTextEdit *this,InputMethodQuery query,
          QVariant argument)

{
  long lVar1;
  long *plVar2;
  int iVar3;
  QRectF QVar4;
  QRectF QVar5;
  int iVar6;
  TextInteractionFlags TVar7;
  undefined8 uVar8;
  QVariant *in_RCX;
  undefined4 uVar9;
  uint uVar10;
  QPoint QVar11;
  QPlainTextEditPrivate *d;
  long in_FS_OFFSET;
  bool bVar12;
  double dVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  QRect QVar21;
  QRect QVar22;
  QPointF QVar23;
  undefined1 auVar24 [16];
  QPointF QVar25;
  double local_b8;
  double dStack_b0;
  undefined8 local_a8;
  qreal qStack_a0;
  QVariant local_78;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined1 *puStack_40;
  long local_38;
  double dVar17;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8;
  if ((int)query < 0x8000) {
    if (query == ImEnabled) {
      if (((((this->super_QAbstractScrollArea).super_QFrame.super_QWidget.data)->widget_attributes &
           1) == 0) && (*(QWidgetTextControl **)(lVar1 + 800) != (QWidgetTextControl *)0x0)) {
        TVar7 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 800));
        bVar12 = SUB41(((uint)TVar7.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                              super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) >> 4,0);
      }
      else {
        bVar12 = false;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
LAB_004a31ee:
        ::QVariant::QVariant(__return_storage_ptr__,bVar12);
        return __return_storage_ptr__;
      }
      goto LAB_004a351a;
    }
    if (query == ImHints) goto LAB_004a308d;
  }
  else {
    if (query == ImInputItemClipRectangle) {
LAB_004a308d:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        QWidget::inputMethodQuery(__return_storage_ptr__,(QWidget *)this,query);
        return __return_storage_ptr__;
      }
      goto LAB_004a351a;
    }
    if (query == ImReadOnly) {
      if (*(QWidgetTextControl **)(lVar1 + 800) == (QWidgetTextControl *)0x0) {
        bVar12 = true;
      }
      else {
        TVar7 = QWidgetTextControl::textInteractionFlags(*(QWidgetTextControl **)(lVar1 + 800));
        bVar12 = ((uint)TVar7.super_QFlagsStorageHelper<Qt::TextInteractionFlag,_4>.
                        super_QFlagsStorage<Qt::TextInteractionFlag>.i & 0x10) == 0;
      }
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) goto LAB_004a31ee;
      goto LAB_004a351a;
    }
  }
  QVar23 = contentOffset(this);
  uVar9 = SUB84(this,0);
  dVar17 = QVar23.yp;
  dVar13 = QVar23.xp;
  iVar6 = ::QVariant::typeId(in_RCX);
  switch(iVar6) {
  case 0x13:
    auVar19 = ::QVariant::toRect();
    auVar20._0_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
    auVar20._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar24 = minpd(_DAT_0066f5d0,auVar20);
    auVar18._8_8_ = -(ulong)(-2147483648.0 < auVar24._8_8_);
    auVar18._0_8_ = -(ulong)(-2147483648.0 < auVar24._0_8_);
    uVar10 = movmskpd(uVar9,auVar18);
    iVar6 = (int)auVar24._8_8_;
    if ((uVar10 & 2) == 0) {
      iVar6 = -0x80000000;
    }
    iVar3 = (int)auVar24._0_8_;
    if ((uVar10 & 1) == 0) {
      iVar3 = -0x80000000;
    }
    QVar21.x1.m_i = auVar19._0_4_ - iVar6;
    QVar21.y1.m_i = auVar19._4_4_ - iVar3;
    QVar21.y2.m_i = auVar19._12_4_ - iVar3;
    QVar21.x2.m_i = auVar19._8_4_ - iVar6;
    ::QVariant::QVariant((QVariant *)&local_58,QVar21);
    break;
  case 0x14:
    ::QVariant::toRectF();
    QVar4.yp = dStack_b0 - dVar17;
    QVar4.xp = local_b8 - dVar13;
    QVar4.w = (qreal)local_a8;
    QVar4.h = qStack_a0;
    ::QVariant::QVariant((QVariant *)&local_58,QVar4);
    break;
  default:
    goto switchD_004a30e9_caseD_15;
  case 0x19:
    uVar8 = ::QVariant::toPoint();
    auVar24._8_8_ = (double)(int)((ulong)uVar8 >> 0x20);
    auVar24._0_8_ = (double)(int)uVar8;
    goto LAB_004a3289;
  case 0x1a:
    auVar24 = ::QVariant::toPointF();
LAB_004a3289:
    QVar23.xp = auVar24._0_8_ - dVar13;
    QVar23.yp = auVar24._8_8_ - dVar17;
    ::QVariant::QVariant((QVariant *)&local_58,QVar23);
  }
  ::QVariant::operator=(in_RCX,(QVariant *)&local_58);
  ::QVariant::~QVariant((QVariant *)&local_58);
switchD_004a30e9_caseD_15:
  local_58._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
  puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
  local_58._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
  plVar2 = *(long **)(lVar1 + 800);
  ::QVariant::QVariant(&local_78,in_RCX);
  (**(code **)(*plVar2 + 0x90))(&local_58,plVar2,query,&local_78);
  ::QVariant::~QVariant(&local_78);
  iVar6 = ::QVariant::typeId((QVariant *)&local_58);
  uVar9 = 0x6ee040;
  switch(iVar6) {
  case 0x13:
    auVar20 = ::QVariant::toRect();
    auVar14._0_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
    auVar14._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar24 = minpd(_DAT_0066f5d0,auVar14);
    auVar15._8_8_ = -(ulong)(-2147483648.0 < auVar24._8_8_);
    auVar15._0_8_ = -(ulong)(-2147483648.0 < auVar24._0_8_);
    uVar10 = movmskpd(uVar9,auVar15);
    iVar6 = (int)auVar24._8_8_;
    if ((uVar10 & 2) == 0) {
      iVar6 = -0x80000000;
    }
    iVar3 = (int)auVar24._0_8_;
    if ((uVar10 & 1) == 0) {
      iVar3 = -0x80000000;
    }
    QVar22.x1.m_i = auVar20._0_4_ + iVar6;
    QVar22.y1.m_i = auVar20._4_4_ + iVar3;
    QVar22.y2.m_i = auVar20._12_4_ + iVar3;
    QVar22.x2.m_i = auVar20._8_4_ + iVar6;
    ::QVariant::QVariant(__return_storage_ptr__,QVar22);
    break;
  case 0x14:
    ::QVariant::toRectF();
    QVar5.yp = dVar17 + dStack_b0;
    QVar5.xp = dVar13 + local_b8;
    QVar5.w = (qreal)local_a8;
    QVar5.h = qStack_a0;
    ::QVariant::QVariant(__return_storage_ptr__,QVar5);
    break;
  default:
    ::QVariant::QVariant(__return_storage_ptr__,(QVariant *)&local_58);
    break;
  case 0x19:
    uVar9 = SUB84(&local_58,0);
    uVar8 = ::QVariant::toPoint();
    auVar19._0_8_ = (double)((ulong)dVar17 & 0x8000000000000000 | 0x3fe0000000000000) + dVar17;
    auVar19._8_8_ = (double)((ulong)dVar13 & 0x8000000000000000 | 0x3fe0000000000000) + dVar13;
    auVar24 = minpd(_DAT_0066f5d0,auVar19);
    auVar16._8_8_ = -(ulong)(-2147483648.0 < auVar24._8_8_);
    auVar16._0_8_ = -(ulong)(-2147483648.0 < auVar24._0_8_);
    uVar10 = movmskpd(uVar9,auVar16);
    iVar6 = (int)auVar24._8_8_;
    if ((uVar10 & 2) == 0) {
      iVar6 = -0x80000000;
    }
    iVar3 = (int)auVar24._0_8_;
    if ((uVar10 & 1) == 0) {
      iVar3 = -0x80000000;
    }
    QVar11.xp.m_i = iVar6 + (int)uVar8;
    QVar11.yp.m_i = iVar3 + (int)((ulong)uVar8 >> 0x20);
    ::QVariant::QVariant(__return_storage_ptr__,QVar11);
    break;
  case 0x1a:
    auVar24 = ::QVariant::toPointF();
    QVar25.xp = auVar24._0_8_ + dVar13;
    QVar25.yp = auVar24._8_8_ + dVar17;
    ::QVariant::QVariant(__return_storage_ptr__,QVar25);
  }
  ::QVariant::~QVariant((QVariant *)&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
LAB_004a351a:
  __stack_chk_fail();
}

Assistant:

QVariant QPlainTextEdit::inputMethodQuery(Qt::InputMethodQuery query, QVariant argument) const
{
    Q_D(const QPlainTextEdit);
    switch (query) {
    case Qt::ImEnabled:
        return isEnabled() && !isReadOnly();
    case Qt::ImHints:
    case Qt::ImInputItemClipRectangle:
        return QWidget::inputMethodQuery(query);
    case Qt::ImReadOnly:
        return isReadOnly();
    default:
        break;
    }

    const QPointF offset = contentOffset();
    switch (argument.userType()) {
    case QMetaType::QRectF:
        argument = argument.toRectF().translated(-offset);
        break;
    case QMetaType::QPointF:
        argument = argument.toPointF() - offset;
        break;
    case QMetaType::QRect:
        argument = argument.toRect().translated(-offset.toPoint());
        break;
    case QMetaType::QPoint:
        argument = argument.toPoint() - offset;
        break;
    default:
        break;
    }

    const QVariant v = d->control->inputMethodQuery(query, argument);
    switch (v.userType()) {
    case QMetaType::QRectF:
        return v.toRectF().translated(offset);
    case QMetaType::QPointF:
        return v.toPointF() + offset;
    case QMetaType::QRect:
        return v.toRect().translated(offset.toPoint());
    case QMetaType::QPoint:
        return v.toPoint() + offset.toPoint();
    default:
        break;
    }
    return v;
}